

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compatibility.cpp
# Opt level: O0

void Cmd_mapchecksum(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ulong local_50;
  size_t j;
  char *wadname;
  byte local_38 [4];
  int i;
  BYTE cksum [16];
  MapData *map;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    Printf("Usage: mapchecksum <map> ...\n");
  }
  wadname._4_4_ = 1;
  while( true ) {
    iVar2 = FCommandLine::argc(argv);
    if (iVar2 <= wadname._4_4_) break;
    pcVar3 = FCommandLine::operator[](argv,wadname._4_4_);
    cksum._8_8_ = P_OpenMapData(pcVar3,true);
    if ((MapData *)cksum._8_8_ == (MapData *)0x0) {
      pcVar3 = FCommandLine::operator[](argv,wadname._4_4_);
      Printf("Cannot load %s as a map\n",pcVar3);
    }
    else {
      MapData::GetChecksum((MapData *)cksum._8_8_,local_38);
      iVar2 = FWadCollection::GetLumpFile(&Wads,*(int *)(cksum._8_8_ + 0xd4));
      pcVar3 = FWadCollection::GetWadName(&Wads,iVar2);
      uVar1 = cksum._8_8_;
      if (cksum._8_8_ != 0) {
        MapData::~MapData((MapData *)cksum._8_8_);
        operator_delete((void *)uVar1,0xe8);
      }
      for (local_50 = 0; local_50 < 0x10; local_50 = local_50 + 1) {
        Printf("%02X",(ulong)local_38[local_50]);
      }
      pcVar4 = FCommandLine::operator[](argv,wadname._4_4_);
      Printf(" // %s %s\n",pcVar3,pcVar4);
    }
    wadname._4_4_ = wadname._4_4_ + 1;
  }
  return;
}

Assistant:

CCMD (mapchecksum)
{
	MapData *map;
	BYTE cksum[16];

	if (argv.argc() < 2)
	{
		Printf("Usage: mapchecksum <map> ...\n");
	}
	for (int i = 1; i < argv.argc(); ++i)
	{
		map = P_OpenMapData(argv[i], true);
		if (map == NULL)
		{
			Printf("Cannot load %s as a map\n", argv[i]);
		}
		else
		{
			map->GetChecksum(cksum);
			const char *wadname = Wads.GetWadName(Wads.GetLumpFile(map->lumpnum));
			delete map;
			for (size_t j = 0; j < sizeof(cksum); ++j)
			{
				Printf("%02X", cksum[j]);
			}
			Printf(" // %s %s\n", wadname, argv[i]);
		}
	}
}